

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O3

MPP_RET mpp_trie_init_by_root(MppTrie *trie,void *root)

{
  MppTrieInfo MVar1;
  long *trie_00;
  MppTrieNode *pMVar2;
  long lVar3;
  MppTrieInfo *pMVar4;
  MppTrieInfo *pMVar5;
  MppTrieInfo *pMVar6;
  MppTrieInfo *name;
  ulong uVar7;
  uint uVar8;
  
  if (trie == (MppTrie *)0x0 || root == (void *)0x0) {
    _mpp_log_l(2,"mpp_trie","invalid trie %px root %px\n","mpp_trie_init_by_root",trie,root);
  }
  else {
    *trie = (MppTrie)0x0;
    trie_00 = (long *)mpp_osal_calloc("mpp_trie_init_by_root",0x58);
    if (trie_00 != (long *)0x0) {
      pMVar2 = mpp_trie_get_node((MppTrieNode *)root,"__name__");
      if ((pMVar2 != (MppTrieNode *)0x0) && (lVar3 = (long)pMVar2->id, -1 < lVar3)) {
        *trie_00 = (long)root + (ulong)*(byte *)((long)root + lVar3 + 3) + lVar3 + 4;
      }
      pMVar2 = mpp_trie_get_node((MppTrieNode *)root,"__node__");
      if ((pMVar2 != (MppTrieNode *)0x0) && (lVar3 = (long)pMVar2->id, -1 < lVar3)) {
        *(undefined4 *)((long)trie_00 + 0x2c) =
             *(undefined4 *)((long)root + (ulong)*(byte *)((long)root + lVar3 + 3) + 4 + lVar3);
      }
      pMVar2 = mpp_trie_get_node((MppTrieNode *)root,"__info__");
      if ((pMVar2 != (MppTrieNode *)0x0) && (lVar3 = (long)pMVar2->id, -1 < lVar3)) {
        *(undefined4 *)(trie_00 + 3) =
             *(undefined4 *)((long)root + (ulong)*(byte *)((long)root + lVar3 + 3) + 4 + lVar3);
      }
      trie_00[6] = (long)root;
      if ((mpp_trie_debug._1_1_ & 1) != 0) {
        mpp_trie_dump(trie_00,"root import");
        root = (void *)trie_00[6];
      }
      if (0 < (int)trie_00[3]) {
        uVar8 = 0;
        pMVar6 = (MppTrieInfo *)((long)root + (long)*(int *)((long)trie_00 + 0x2c) * 0x38);
        do {
          name = pMVar6 + 1;
          if (pMVar6 == (MppTrieInfo *)0x0) {
            name = (MppTrieInfo *)0x0;
          }
          pMVar4 = mpp_trie_get_info(trie_00,(char *)name);
          if ((pMVar6 == (MppTrieInfo *)0x0) ||
             (MVar1 = *pMVar6, (int)trie_00[3] + -1 <= (int)((uint)MVar1 & 0xfff))) {
            pMVar5 = (MppTrieInfo *)0x0;
          }
          else {
            pMVar5 = (MppTrieInfo *)
                     ((long)&pMVar6[1].field_0x0 +
                     (ulong)((uint)MVar1 >> 0xc & 0xfff) + (ulong)((uint)MVar1 >> 0x18));
          }
          if ((pMVar4 == (MppTrieInfo *)0x0) || (pMVar6 != pMVar4)) {
            if (pMVar4 == (MppTrieInfo *)0x0) {
              uVar7 = 0xffffffff;
              pMVar4 = (MppTrieInfo *)0x0;
            }
            else {
              uVar7 = (ulong)((uint)*pMVar4 & 0xfff);
            }
LAB_00139209:
            _mpp_log_l(2,"mpp_trie",
                       "trie check on import found mismatch info %s [%d:%p] - [%d:%p]\n",
                       "mpp_trie_init_by_root",name,(ulong)uVar8,pMVar6,uVar7,pMVar4);
            return MPP_NOK;
          }
          uVar7 = (ulong)((uint)*pMVar4 & 0xfff);
          if (uVar8 != ((uint)*pMVar4 & 0xfff)) goto LAB_00139209;
          uVar8 = uVar8 + 1;
          pMVar6 = pMVar5;
        } while ((int)uVar8 < (int)trie_00[3]);
      }
      *trie = trie_00;
      return MPP_OK;
    }
    _mpp_log_l(2,"mpp_trie","create trie impl failed\n","mpp_trie_init_by_root");
  }
  return MPP_NOK;
}

Assistant:

MPP_RET mpp_trie_init_by_root(MppTrie *trie, void *root)
{
    MppTrieImpl *p;
    MppTrieInfo *info;
    RK_S32 i;

    if (!trie || !root) {
        mpp_loge_f("invalid trie %px root %px\n", trie, root);
        return MPP_NOK;
    }

    *trie = NULL;
    p = mpp_calloc_size(MppTrieImpl, sizeof(MppTrieImpl));
    if (!p) {
        mpp_err_f("create trie impl failed\n");
        return MPP_NOK;
    }

    info = mpp_trie_get_info_from_root(root, "__name__");
    if (info)
        p->name = (char *)mpp_trie_info_ctx(info);

    info = mpp_trie_get_info_from_root(root, "__node__");
    if (info)
        p->node_used = *(RK_U32 *)mpp_trie_info_ctx(info);

    info = mpp_trie_get_info_from_root(root, "__info__");
    if (info)
        p->info_used = *(RK_U32 *)mpp_trie_info_ctx(info);

    /* import and update new buffer */
    p->nodes = (MppTrieNode *)root;

    if (mpp_trie_debug & MPP_TRIE_DBG_IMPORT)
        mpp_trie_dump(p, "root import");

    info = mpp_trie_get_info_first(p);

    for (i = 0; i < p->info_used; i++) {
        const char *name = mpp_trie_info_name(info);
        MppTrieInfo *info_set = info;
        MppTrieInfo *info_ret = mpp_trie_get_info(p, name);

        info = mpp_trie_get_info_next(p, info);

        if (info_ret && info_set == info_ret && info_ret->index == i)
            continue;

        mpp_loge_f("trie check on import found mismatch info %s [%d:%p] - [%d:%p]\n",
                   name, i, info_set, info_ret ? info_ret->index : -1, info_ret);
        return MPP_NOK;
    }

    *trie = p;

    return MPP_OK;
}